

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddVerify.cpp
# Opt level: O0

void AddVerifyBase<signed_char,int>(char *types)

{
  bool bVar1;
  char *pcVar2;
  TestCase<signed_char,_int,_3> TVar3;
  string msg_2;
  char x;
  string msg_1;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  string msg;
  char ret;
  TestCase<signed_char,_int,_3> test;
  TestVector<signed_char,_int,_3> tests;
  char *in_stack_fffffffffffffd88;
  allocator *in_stack_fffffffffffffd90;
  allocator *in_stack_fffffffffffffd98;
  TestVector<signed_char,_int,_3> *in_stack_fffffffffffffda0;
  allocator local_201;
  string local_200 [23];
  undefined1 in_stack_fffffffffffffe17;
  int in_stack_fffffffffffffe18;
  char in_stack_fffffffffffffe1f;
  string *in_stack_fffffffffffffe20;
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_178;
  char local_172;
  allocator local_171;
  string local_170 [39];
  allocator local_149;
  string local_148 [32];
  string local_128 [32];
  string local_108 [37];
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_e3;
  byte local_e2;
  allocator local_e1;
  string local_e0 [55];
  allocator local_a9;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [40];
  undefined8 local_40;
  undefined1 local_38;
  undefined8 local_2c;
  byte local_24;
  TestVector<signed_char,_int,_3> local_20;
  
  TestVector<signed_char,_int,_3>::TestVector(&local_20);
  TVar3 = TestVector<signed_char,_int,_3>::GetNext(in_stack_fffffffffffffda0);
  local_40 = TVar3._0_8_;
  local_38 = TVar3.fExpected;
  local_2c = local_40;
  local_24 = local_38;
  while( true ) {
    bVar1 = TestVector<signed_char,_int,_3>::Done(&local_20);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    bVar1 = SafeAdd<signed_char,int>
                      ((char)((ulong)in_stack_fffffffffffffd90 >> 0x38),
                       (int)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    if (bVar1 != (bool)(local_24 & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,"Error in case ",&local_a9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
      std::__cxx11::string::~string(local_88);
      std::__cxx11::string::~string(local_a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e0,pcVar2,&local_e1);
      err_msg<signed_char,int>
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18,
                 (bool)in_stack_fffffffffffffe17);
      std::__cxx11::string::~string(local_e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_e1);
      std::__cxx11::string::~string(local_68);
    }
    local_e2 = 1;
    SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt(&local_e3,(char *)&local_2c);
    SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator+=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)in_stack_fffffffffffffd90,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
    if ((local_e2 & 1) != (local_24 & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_148,"Error in case ",&local_149);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
      std::__cxx11::string::~string(local_128);
      std::__cxx11::string::~string(local_148);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
      in_stack_fffffffffffffda0 = (TestVector<signed_char,_int,_3> *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_170,(char *)in_stack_fffffffffffffda0,&local_171);
      err_msg<signed_char,int>
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18,
                 (bool)in_stack_fffffffffffffe17);
      std::__cxx11::string::~string(local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      std::__cxx11::string::~string(local_108);
    }
    local_e2 = 1;
    local_172 = (char)local_2c;
    SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              (&local_178,(int *)((long)&local_2c + 4));
    operator+=((char *)in_stack_fffffffffffffd98,
               (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               )(int)((ulong)in_stack_fffffffffffffda0 >> 0x20));
    if ((local_e2 & 1) != (local_24 & 1)) {
      in_stack_fffffffffffffd98 = (allocator *)&stack0xfffffffffffffe27;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d8,"Error in case ",in_stack_fffffffffffffd98);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
      std::__cxx11::string::~string(local_1b8);
      std::__cxx11::string::~string(local_1d8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe27);
      in_stack_fffffffffffffd88 = (char *)std::__cxx11::string::c_str();
      in_stack_fffffffffffffd90 = &local_201;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_200,in_stack_fffffffffffffd88,in_stack_fffffffffffffd90);
      err_msg<signed_char,int>
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18,
                 (bool)in_stack_fffffffffffffe17);
      std::__cxx11::string::~string(local_200);
      std::allocator<char>::~allocator((allocator<char> *)&local_201);
      std::__cxx11::string::~string(local_198);
    }
    TVar3 = TestVector<signed_char,_int,_3>::GetNext(in_stack_fffffffffffffda0);
    local_2c = TVar3._0_8_;
    local_24 = TVar3.fExpected;
  }
  return;
}

Assistant:

void AddVerifyBase(const char* types)
{
	TestVector< T, U, OpType::Add > tests;
	TestCase< T, U, OpType::Add > test = tests.GetNext();

	while (!tests.Done())
	{
		T ret;
		if (SafeAdd(test.x, test.y, ret) != test.fExpected)
		{
			std::string msg = std::string("Error in case ") + types + ": ";
			err_msg(msg.c_str(), test.x, test.y, test.fExpected);
		}

		// Now test throwing version
		bool fSuccess = true;
		try
		{
			SafeInt<T> si(test.x);
			si += test.y;
		}
		catch (...)
		{
			fSuccess = false;
		}

		if (fSuccess != test.fExpected)
		{
			std::string msg = std::string("Error in case ") + types + " throw (1): ";
			err_msg(msg.c_str(), test.x, test.y, test.fExpected);
		}

		// Also need to test the version that assigns back out
		// to a plain int, as it has different logic
		fSuccess = true;
		try
		{
			T x(test.x);
			x += SafeInt<U>(test.y);
		}
		catch (...)
		{
			fSuccess = false;
		}

		if (fSuccess != test.fExpected)
		{
			std::string msg = std::string("Error in case ") + types + " throw (2): ";
			err_msg(msg.c_str(), test.x, test.y, test.fExpected);
		}

		test = tests.GetNext();
	}
}